

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

void dynamic_display(menu_conflict *m,int oid,_Bool cursor,int row,int col,int width)

{
  _func_int_menu_ptr_int *p_Var1;
  uint8_t (*pauVar2) [2];
  uint uVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000011;
  
  p_Var1 = m->row_funcs->valid_row;
  if (p_Var1 == (_func_int_menu_ptr_int *)0x0) {
    pauVar2 = curs_attrs + 1;
  }
  else {
    uVar3 = (*p_Var1)(m,oid);
    pauVar2 = curs_attrs + ((uVar3 & 0xfffffffd) != 0);
  }
  puVar4 = (undefined8 *)m->menu_data;
  if (oid != 0) {
    do {
      puVar4 = (undefined8 *)puVar4[2];
      if (puVar4 == (undefined8 *)0x0) {
        __assert_fail("entry",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                      ,0x40e,"void dynamic_display(struct menu *, int, _Bool, int, int, int)");
      }
      oid = oid + -1;
    } while (oid != 0);
  }
  Term_putstr(col,row,width,(uint)(*pauVar2)[CONCAT71(in_register_00000011,cursor) & 0xffffffff],
              (char *)*puVar4);
  return;
}

Assistant:

static void dynamic_display(struct menu *m, int oid, bool cursor,
		int row, int col, int width)
{
	struct menu_entry *entry;
	uint8_t color = curs_attrs[MN_ROW_STYLE_ENABLED][0 != cursor];

	/* Hack? While row_funcs is private, we need to be consistent with what the menu will do. */
	if (m->row_funcs->valid_row) {
		menu_row_validity_t row_valid = m->row_funcs->valid_row(m, oid);
		menu_row_style_t style = menu_row_style_for_validity(row_valid);
		color = curs_attrs[style][0 != cursor];
	}

	for (entry = menu_priv(m); oid; oid--) {
		entry = entry->next;
		assert(entry);
	}

	Term_putstr(col, row, width, color, entry->text);
}